

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O1

void __thiscall KokkosTools::ChromeTracing::State::State(State *this)

{
  uint uVar1;
  rep rVar2;
  char *pcVar3;
  char *__name;
  char *__s;
  char *pcVar4;
  
  std::ofstream::ofstream(this);
  (this->current_stack).
  super__Vector_base<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->current_stack).
  super__Vector_base<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->current_stack).
  super__Vector_base<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->my_base_time).impl.__d.__r = rVar2;
  this->my_mpi_rank = -1;
  this->first = true;
  pcVar3 = getenv("OMPI_COMM_WORLD_RANK");
  __name = (char *)malloc(0x100);
  gethostname(__name,0x100);
  __s = (char *)malloc(0x100);
  uVar1 = getpid();
  pcVar4 = "0";
  if (pcVar3 != (char *)0x0) {
    pcVar4 = pcVar3;
  }
  snprintf(__s,0x100,"%s-%d-%s.json",__name,(ulong)uVar1,pcVar4);
  this->my_mpi_rank = 0;
  free(__name);
  std::ofstream::open((char *)this,(_Ios_Openmode)__s);
  free(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[\n",2);
  std::
  vector<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
  ::reserve(&this->current_stack,0x14);
  return;
}

Assistant:

State() : my_base_time(now()) {
    char *mpi_rank = getenv("OMPI_COMM_WORLD_RANK");

    char *hostname = (char *)malloc(sizeof(char) * 256);
    gethostname(hostname, 256);

    char *fileOutput = (char *)malloc(sizeof(char) * 256);
    snprintf(fileOutput, 256, "%s-%d-%s.json", hostname, (int)getpid(),
             (NULL == mpi_rank) ? "0" : mpi_rank);
#if defined(USE_MPI) && USE_MPI
    MPI_Comm_rank(MPI_COMM_WORLD, &my_mpi_rank);
#else
    my_mpi_rank = 0;
#endif

    free(hostname);
    outfile.open(fileOutput, std::ios::out);
    free(fileOutput);

    outfile << "[\n";
    current_stack.reserve(20);
  }